

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

size_t boost::unordered::detail::foa::
       table_arrays<std::pair<const_slang::SVInt,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
       ::buffer_size(size_t groups_size)

{
  unsigned_long buffer_bytes;
  size_t groups_size_local;
  
  return (groups_size * 0x178 + 0xe) / 0x18;
}

Assistant:

static std::size_t buffer_size(std::size_t groups_size) {
        auto buffer_bytes =
            /* space for elements (we subtract 1 because of the sentinel) */
            sizeof(value_type) * (groups_size * N - 1) +
            /* space for groups + padding for group alignment */
            sizeof(group_type) * (groups_size + 1) - 1;

        /* ceil(buffer_bytes/sizeof(value_type)) */
        return (buffer_bytes + sizeof(value_type) - 1) / sizeof(value_type);
    }